

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

ggml_tensor * ggml_reshape(ggml_context *ctx,ggml_tensor *a,ggml_tensor *b)

{
  _Bool _Var1;
  ggml_tensor *pgVar2;
  undefined8 uVar3;
  char *pcVar4;
  
  _Var1 = ggml_is_contiguous(a);
  if (_Var1) {
    _Var1 = ggml_is_contiguous(b);
    if (_Var1) {
      if (a->ne[1] * a->ne[0] * a->ne[2] * a->ne[3] == b->ne[1] * b->ne[0] * b->ne[2] * b->ne[3]) {
        if ((a->grad == (ggml_tensor *)0x0) && (b->grad == (ggml_tensor *)0x0)) {
          pgVar2 = ggml_new_tensor_impl(ctx,a->type,b->n_dims,b->ne,a->data);
          pgVar2->op = GGML_OP_RESHAPE;
          pgVar2->grad = (ggml_tensor *)0x0;
          pgVar2->src0 = a;
          pgVar2->src1 = (ggml_tensor *)0x0;
          return pgVar2;
        }
        pcVar4 = "false";
        uVar3 = 0xec2;
      }
      else {
        pcVar4 = "ggml_nelements(a) == ggml_nelements(b)";
        uVar3 = 0xebd;
      }
    }
    else {
      pcVar4 = "ggml_is_contiguous(b)";
      uVar3 = 0xebc;
    }
  }
  else {
    pcVar4 = "ggml_is_contiguous(a)";
    uVar3 = 0xebb;
  }
  fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",uVar3,
          pcVar4);
  abort();
}

Assistant:

struct ggml_tensor * ggml_reshape(
        struct ggml_context * ctx,
        struct ggml_tensor * a,
        struct ggml_tensor * b) {
    GGML_ASSERT(ggml_is_contiguous(a));
    GGML_ASSERT(ggml_is_contiguous(b));
    GGML_ASSERT(ggml_nelements(a) == ggml_nelements(b));

    bool is_node = false;

    if (a->grad || b->grad) {
        GGML_ASSERT(false); // TODO: implement backward
        is_node = true;
    }

    struct ggml_tensor * result = ggml_new_tensor_impl(ctx, a->type, b->n_dims, b->ne, a->data);

    result->op   = GGML_OP_RESHAPE;
    result->grad = is_node ? ggml_dup_tensor(ctx, result) : NULL;
    result->src0 = a;
    result->src1 = NULL;

    return result;
}